

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O0

Sign anon_unknown.dwarf_5292d::side4h_3d_exact_SOS
               (double *p0,double *p1,double *p2,double *p3,double *p4,double h0,double h1,double h2
               ,double h3,double h4,bool sos)

{
  double dVar1;
  double dVar2;
  long lVar3;
  allocator *paVar4;
  expansion *peVar5;
  index_t iVar6;
  size_t sVar7;
  expansion *peVar8;
  expansion *peVar9;
  expansion *peVar10;
  expansion *peVar11;
  expansion *peVar12;
  expansion *peVar13;
  expansion *peVar14;
  uchar *sig;
  uchar *sig_00;
  uchar *extraout_RDX;
  uchar *sig_01;
  uchar *extraout_RDX_00;
  uchar *extraout_RDX_01;
  uchar *extraout_RDX_02;
  uchar *extraout_RDX_03;
  uchar *sig_02;
  expansion *peVar15;
  expansion *peVar16;
  double adStack_320 [2];
  expansion eStack_310;
  expansion *local_2f8;
  expansion *local_2f0;
  expansion *local_2e8;
  expansion *local_2e0;
  expansion *local_2d8;
  expansion *local_2d0;
  expansion *local_2c8;
  expansion *local_2c0;
  allocator *local_2b8;
  allocator *local_2b0;
  expansion *local_2a8;
  expansion *local_2a0;
  expansion *local_298;
  expansion *local_290;
  expansion *local_288;
  expansion *local_280;
  expansion *local_278;
  expansion *local_270;
  expansion *local_268;
  expansion *local_260;
  expansion *local_258;
  expansion *local_250;
  expansion *local_248;
  expansion *local_240;
  expansion *local_238;
  expansion *local_230;
  expansion *local_228;
  expansion *local_220;
  expansion *local_218;
  expansion *local_210;
  int local_208;
  int local_204;
  Sign Delta3_sign;
  Sign Delta2_sign;
  Sign Delta1_sign;
  Sign z_sign;
  expansion *z;
  expansion *z2;
  expansion *z1;
  double *pdStack_1d8;
  index_t i;
  double *p_sort [5];
  Sign r_sign;
  expansion *r;
  expansion *r_4;
  expansion *r_3;
  expansion *r_2;
  expansion *r_1;
  string local_178 [55];
  allocator local_141;
  string local_140 [36];
  int local_11c;
  expansion *peStack_118;
  Sign Delta4_sign;
  expansion *Delta4;
  expansion *Delta3;
  expansion *Delta2;
  expansion *Delta1;
  expansion *a44;
  expansion *a43;
  expansion *a42;
  expansion *a41;
  expansion *a34;
  expansion *a33;
  expansion *a32;
  expansion *a31;
  expansion *a24;
  expansion *a23;
  expansion *a22;
  expansion *a21;
  expansion *a14;
  expansion *a13;
  expansion *a12;
  expansion *a11;
  double dStack_70;
  bool sos_local;
  double h4_local;
  double h3_local;
  double h2_local;
  double h1_local;
  double h0_local;
  double *p4_local;
  double *p3_local;
  double *p2_local;
  double *p1_local;
  double *p0_local;
  
  eStack_310.x_[1] = 9.30167510112398e-318;
  a11._7_1_ = sos;
  dStack_70 = h4;
  h4_local = h3;
  h3_local = h2;
  h2_local = h1;
  h1_local = h0;
  h0_local = (double)p4;
  p4_local = p3;
  p3_local = p2;
  p2_local = p1;
  p1_local = p0;
  iVar6 = GEO::expansion::diff_capacity(*p1,*p0);
  eStack_310.x_[1] = 9.30170968571919e-318;
  sVar7 = GEO::expansion::bytes(iVar6);
  lVar3 = -(sVar7 + 0xf & 0xfffffffffffffff0);
  dVar1 = *p2_local;
  dVar2 = *p1_local;
  local_2a8 = (expansion *)((long)&local_2f8 + lVar3);
  *(undefined8 *)((long)&eStack_310 + lVar3 + 0x10) = 0x1cba6f;
  iVar6 = GEO::expansion::diff_capacity(dVar1,dVar2);
  peVar9 = local_2a8;
  *(undefined8 *)((long)&eStack_310 + lVar3 + 0x10) = 0x1cba7d;
  GEO::expansion::expansion(peVar9,iVar6);
  peVar9 = local_2a8;
  dVar1 = *p2_local;
  dVar2 = *p1_local;
  *(undefined8 *)((long)&eStack_310 + lVar3 + 0x10) = 0x1cba99;
  a12 = GEO::expansion::assign_diff(peVar9,dVar1,dVar2);
  dVar1 = p2_local[1];
  dVar2 = p1_local[1];
  *(undefined8 *)((long)&eStack_310 + lVar3 + 0x10) = 0x1cbab4;
  iVar6 = GEO::expansion::diff_capacity(dVar1,dVar2);
  *(undefined8 *)((long)&eStack_310 + lVar3 + 0x10) = 0x1cbabb;
  sVar7 = GEO::expansion::bytes(iVar6);
  peVar8 = (expansion *)(((long)&local_2f8 + lVar3) - (sVar7 + 0xf & 0xfffffffffffffff0));
  dVar1 = p2_local[1];
  dVar2 = p1_local[1];
  local_2a0 = peVar8;
  peVar8[-1].x_[1] = 9.30256935994295e-318;
  iVar6 = GEO::expansion::diff_capacity(dVar1,dVar2);
  peVar9 = local_2a0;
  peVar8[-1].x_[1] = 9.30263852913337e-318;
  GEO::expansion::expansion(peVar9,iVar6);
  peVar9 = local_2a0;
  dVar1 = p2_local[1];
  dVar2 = p1_local[1];
  peVar8[-1].x_[1] = 9.30278674882712e-318;
  a13 = GEO::expansion::assign_diff(peVar9,dVar1,dVar2);
  dVar1 = p2_local[2];
  dVar2 = p1_local[2];
  peVar8[-1].x_[1] = 9.3029201465515e-318;
  iVar6 = GEO::expansion::diff_capacity(dVar1,dVar2);
  peVar8[-1].x_[1] = 9.30295473114671e-318;
  sVar7 = GEO::expansion::bytes(iVar6);
  peVar8 = (expansion *)((long)peVar8 - (sVar7 + 0xf & 0xfffffffffffffff0));
  dVar1 = p2_local[2];
  dVar2 = p1_local[2];
  local_298 = peVar8;
  peVar8[-1].x_[1] = 9.30320176396963e-318;
  iVar6 = GEO::expansion::diff_capacity(dVar1,dVar2);
  peVar9 = local_298;
  peVar8[-1].x_[1] = 9.30327093316005e-318;
  GEO::expansion::expansion(peVar9,iVar6);
  peVar9 = local_298;
  dVar1 = p2_local[2];
  dVar2 = p1_local[2];
  peVar8[-1].x_[1] = 9.3034191528538e-318;
  a14 = GEO::expansion::assign_diff(peVar9,dVar1,dVar2);
  dVar2 = h1_local;
  dVar1 = h2_local;
  peVar8[-1].x_[1] = 9.30352784729589e-318;
  iVar6 = GEO::expansion::diff_capacity(dVar2,dVar1);
  peVar8[-1].x_[1] = 9.30356243189109e-318;
  sVar7 = GEO::expansion::bytes(iVar6);
  dVar2 = h1_local;
  dVar1 = h2_local;
  peVar8 = (expansion *)((long)peVar8 - (sVar7 + 0xf & 0xfffffffffffffff0));
  local_290 = peVar8;
  peVar8[-1].x_[1] = 9.30376993946235e-318;
  iVar6 = GEO::expansion::diff_capacity(dVar2,dVar1);
  peVar9 = local_290;
  peVar8[-1].x_[1] = 9.30383910865277e-318;
  GEO::expansion::expansion(peVar9,iVar6);
  dVar2 = h1_local;
  dVar1 = h2_local;
  peVar9 = local_290;
  peVar8[-1].x_[1] = 9.30394780309485e-318;
  a21 = GEO::expansion::assign_diff(peVar9,dVar2,dVar1);
  dVar1 = *p3_local;
  dVar2 = *p1_local;
  peVar8[-1].x_[1] = 9.30408614147569e-318;
  iVar6 = GEO::expansion::diff_capacity(dVar1,dVar2);
  peVar8[-1].x_[1] = 9.30412072607089e-318;
  sVar7 = GEO::expansion::bytes(iVar6);
  peVar8 = (expansion *)((long)peVar8 - (sVar7 + 0xf & 0xfffffffffffffff0));
  dVar1 = *p3_local;
  dVar2 = *p1_local;
  local_288 = peVar8;
  peVar8[-1].x_[1] = 9.3043578775809e-318;
  iVar6 = GEO::expansion::diff_capacity(dVar1,dVar2);
  peVar9 = local_288;
  peVar8[-1].x_[1] = 9.30442704677132e-318;
  GEO::expansion::expansion(peVar9,iVar6);
  peVar9 = local_288;
  dVar1 = *p3_local;
  dVar2 = *p1_local;
  peVar8[-1].x_[1] = 9.30456538515215e-318;
  a22 = GEO::expansion::assign_diff(peVar9,dVar1,dVar2);
  dVar1 = p3_local[1];
  dVar2 = p1_local[1];
  peVar8[-1].x_[1] = 9.3047136048459e-318;
  iVar6 = GEO::expansion::diff_capacity(dVar1,dVar2);
  peVar8[-1].x_[1] = 9.30474818944111e-318;
  sVar7 = GEO::expansion::bytes(iVar6);
  peVar8 = (expansion *)((long)peVar8 - (sVar7 + 0xf & 0xfffffffffffffff0));
  dVar1 = p3_local[1];
  dVar2 = p1_local[1];
  local_280 = peVar8;
  peVar8[-1].x_[1] = 9.30499522226403e-318;
  iVar6 = GEO::expansion::diff_capacity(dVar1,dVar2);
  peVar9 = local_280;
  peVar8[-1].x_[1] = 9.30506439145445e-318;
  GEO::expansion::expansion(peVar9,iVar6);
  peVar9 = local_280;
  dVar1 = p3_local[1];
  dVar2 = p1_local[1];
  peVar8[-1].x_[1] = 9.3052126111482e-318;
  a23 = GEO::expansion::assign_diff(peVar9,dVar1,dVar2);
  dVar1 = p3_local[2];
  dVar2 = p1_local[2];
  peVar8[-1].x_[1] = 9.30536083084196e-318;
  iVar6 = GEO::expansion::diff_capacity(dVar1,dVar2);
  peVar8[-1].x_[1] = 9.30539541543717e-318;
  sVar7 = GEO::expansion::bytes(iVar6);
  peVar8 = (expansion *)((long)peVar8 - (sVar7 + 0xf & 0xfffffffffffffff0));
  dVar1 = p3_local[2];
  dVar2 = p1_local[2];
  local_278 = peVar8;
  peVar8[-1].x_[1] = 9.30564244826009e-318;
  iVar6 = GEO::expansion::diff_capacity(dVar1,dVar2);
  peVar9 = local_278;
  peVar8[-1].x_[1] = 9.3057116174505e-318;
  GEO::expansion::expansion(peVar9,iVar6);
  peVar9 = local_278;
  dVar1 = p3_local[2];
  dVar2 = p1_local[2];
  peVar8[-1].x_[1] = 9.30585983714426e-318;
  a24 = GEO::expansion::assign_diff(peVar9,dVar1,dVar2);
  dVar2 = h1_local;
  dVar1 = h3_local;
  peVar8[-1].x_[1] = 9.30596853158634e-318;
  iVar6 = GEO::expansion::diff_capacity(dVar2,dVar1);
  peVar8[-1].x_[1] = 9.30600311618155e-318;
  sVar7 = GEO::expansion::bytes(iVar6);
  dVar2 = h1_local;
  dVar1 = h3_local;
  peVar8 = (expansion *)((long)peVar8 - (sVar7 + 0xf & 0xfffffffffffffff0));
  local_270 = peVar8;
  peVar8[-1].x_[1] = 9.3062106237528e-318;
  iVar6 = GEO::expansion::diff_capacity(dVar2,dVar1);
  peVar9 = local_270;
  peVar8[-1].x_[1] = 9.30627979294322e-318;
  GEO::expansion::expansion(peVar9,iVar6);
  dVar2 = h1_local;
  dVar1 = h3_local;
  peVar9 = local_270;
  peVar8[-1].x_[1] = 9.30638848738531e-318;
  a31 = GEO::expansion::assign_diff(peVar9,dVar2,dVar1);
  dVar1 = *p4_local;
  dVar2 = *p1_local;
  peVar8[-1].x_[1] = 9.30652682576614e-318;
  iVar6 = GEO::expansion::diff_capacity(dVar1,dVar2);
  peVar8[-1].x_[1] = 9.30656141036135e-318;
  sVar7 = GEO::expansion::bytes(iVar6);
  peVar8 = (expansion *)((long)peVar8 - (sVar7 + 0xf & 0xfffffffffffffff0));
  dVar1 = *p4_local;
  dVar2 = *p1_local;
  local_268 = peVar8;
  peVar8[-1].x_[1] = 9.30679856187135e-318;
  iVar6 = GEO::expansion::diff_capacity(dVar1,dVar2);
  peVar9 = local_268;
  peVar8[-1].x_[1] = 9.30686773106177e-318;
  GEO::expansion::expansion(peVar9,iVar6);
  peVar9 = local_268;
  dVar1 = *p4_local;
  dVar2 = *p1_local;
  peVar8[-1].x_[1] = 9.30700606944261e-318;
  a32 = GEO::expansion::assign_diff(peVar9,dVar1,dVar2);
  dVar1 = p4_local[1];
  dVar2 = p1_local[1];
  peVar8[-1].x_[1] = 9.30715428913636e-318;
  iVar6 = GEO::expansion::diff_capacity(dVar1,dVar2);
  peVar8[-1].x_[1] = 9.30718887373157e-318;
  sVar7 = GEO::expansion::bytes(iVar6);
  peVar8 = (expansion *)((long)peVar8 - (sVar7 + 0xf & 0xfffffffffffffff0));
  dVar1 = p4_local[1];
  dVar2 = p1_local[1];
  local_260 = peVar8;
  peVar8[-1].x_[1] = 9.30743590655449e-318;
  iVar6 = GEO::expansion::diff_capacity(dVar1,dVar2);
  peVar9 = local_260;
  peVar8[-1].x_[1] = 9.30750507574491e-318;
  GEO::expansion::expansion(peVar9,iVar6);
  peVar9 = local_260;
  dVar1 = p4_local[1];
  dVar2 = p1_local[1];
  peVar8[-1].x_[1] = 9.30765329543866e-318;
  a33 = GEO::expansion::assign_diff(peVar9,dVar1,dVar2);
  dVar1 = p4_local[2];
  dVar2 = p1_local[2];
  peVar8[-1].x_[1] = 9.30780151513241e-318;
  iVar6 = GEO::expansion::diff_capacity(dVar1,dVar2);
  peVar8[-1].x_[1] = 9.30783609972762e-318;
  sVar7 = GEO::expansion::bytes(iVar6);
  peVar8 = (expansion *)((long)peVar8 - (sVar7 + 0xf & 0xfffffffffffffff0));
  dVar1 = p4_local[2];
  dVar2 = p1_local[2];
  local_258 = peVar8;
  peVar8[-1].x_[1] = 9.30808313255054e-318;
  iVar6 = GEO::expansion::diff_capacity(dVar1,dVar2);
  peVar9 = local_258;
  peVar8[-1].x_[1] = 9.30815230174096e-318;
  GEO::expansion::expansion(peVar9,iVar6);
  peVar9 = local_258;
  dVar1 = p4_local[2];
  dVar2 = p1_local[2];
  peVar8[-1].x_[1] = 9.30830052143471e-318;
  a34 = GEO::expansion::assign_diff(peVar9,dVar1,dVar2);
  dVar2 = h1_local;
  dVar1 = h4_local;
  peVar8[-1].x_[1] = 9.3084092158768e-318;
  iVar6 = GEO::expansion::diff_capacity(dVar2,dVar1);
  peVar8[-1].x_[1] = 9.30844380047201e-318;
  sVar7 = GEO::expansion::bytes(iVar6);
  dVar2 = h1_local;
  dVar1 = h4_local;
  peVar8 = (expansion *)((long)peVar8 - (sVar7 + 0xf & 0xfffffffffffffff0));
  local_250 = peVar8;
  peVar8[-1].x_[1] = 9.30865130804326e-318;
  iVar6 = GEO::expansion::diff_capacity(dVar2,dVar1);
  peVar9 = local_250;
  peVar8[-1].x_[1] = 9.30872047723368e-318;
  GEO::expansion::expansion(peVar9,iVar6);
  dVar2 = h1_local;
  dVar1 = h4_local;
  peVar9 = local_250;
  peVar8[-1].x_[1] = 9.30882917167576e-318;
  a41 = GEO::expansion::assign_diff(peVar9,dVar2,dVar1);
  dVar1 = *(double *)h0_local;
  dVar2 = *p1_local;
  peVar8[-1].x_[1] = 9.3089675100566e-318;
  iVar6 = GEO::expansion::diff_capacity(dVar1,dVar2);
  peVar8[-1].x_[1] = 9.30900209465181e-318;
  sVar7 = GEO::expansion::bytes(iVar6);
  peVar8 = (expansion *)((long)peVar8 - (sVar7 + 0xf & 0xfffffffffffffff0));
  dVar1 = *(double *)h0_local;
  dVar2 = *p1_local;
  local_248 = peVar8;
  peVar8[-1].x_[1] = 9.30923924616181e-318;
  iVar6 = GEO::expansion::diff_capacity(dVar1,dVar2);
  peVar9 = local_248;
  peVar8[-1].x_[1] = 9.30930841535223e-318;
  GEO::expansion::expansion(peVar9,iVar6);
  peVar9 = local_248;
  dVar1 = *(double *)h0_local;
  dVar2 = *p1_local;
  peVar8[-1].x_[1] = 9.30944675373306e-318;
  a42 = GEO::expansion::assign_diff(peVar9,dVar1,dVar2);
  dVar1 = *(double *)((long)h0_local + 8);
  dVar2 = p1_local[1];
  peVar8[-1].x_[1] = 9.30959497342682e-318;
  iVar6 = GEO::expansion::diff_capacity(dVar1,dVar2);
  peVar8[-1].x_[1] = 9.30962955802202e-318;
  sVar7 = GEO::expansion::bytes(iVar6);
  peVar8 = (expansion *)((long)peVar8 - (sVar7 + 0xf & 0xfffffffffffffff0));
  dVar1 = *(double *)((long)h0_local + 8);
  dVar2 = p1_local[1];
  local_240 = peVar8;
  peVar8[-1].x_[1] = 9.30987659084495e-318;
  iVar6 = GEO::expansion::diff_capacity(dVar1,dVar2);
  peVar9 = local_240;
  peVar8[-1].x_[1] = 9.30994576003536e-318;
  GEO::expansion::expansion(peVar9,iVar6);
  peVar9 = local_240;
  dVar1 = *(double *)((long)h0_local + 8);
  dVar2 = p1_local[1];
  peVar8[-1].x_[1] = 9.31009397972912e-318;
  a43 = GEO::expansion::assign_diff(peVar9,dVar1,dVar2);
  dVar1 = *(double *)((long)h0_local + 0x10);
  dVar2 = p1_local[2];
  peVar8[-1].x_[1] = 9.31024219942287e-318;
  iVar6 = GEO::expansion::diff_capacity(dVar1,dVar2);
  peVar8[-1].x_[1] = 9.31027678401808e-318;
  sVar7 = GEO::expansion::bytes(iVar6);
  peVar8 = (expansion *)((long)peVar8 - (sVar7 + 0xf & 0xfffffffffffffff0));
  dVar1 = *(double *)((long)h0_local + 0x10);
  dVar2 = p1_local[2];
  local_238 = peVar8;
  peVar8[-1].x_[1] = 9.310523816841e-318;
  iVar6 = GEO::expansion::diff_capacity(dVar1,dVar2);
  peVar9 = local_238;
  peVar8[-1].x_[1] = 9.31059298603141e-318;
  GEO::expansion::expansion(peVar9,iVar6);
  peVar9 = local_238;
  dVar1 = *(double *)((long)h0_local + 0x10);
  dVar2 = p1_local[2];
  peVar8[-1].x_[1] = 9.31074120572517e-318;
  a44 = GEO::expansion::assign_diff(peVar9,dVar1,dVar2);
  dVar2 = h1_local;
  dVar1 = dStack_70;
  peVar8[-1].x_[1] = 9.31084990016725e-318;
  iVar6 = GEO::expansion::diff_capacity(dVar2,dVar1);
  peVar8[-1].x_[1] = 9.31088448476246e-318;
  sVar7 = GEO::expansion::bytes(iVar6);
  dVar2 = h1_local;
  dVar1 = dStack_70;
  peVar8 = (expansion *)((long)peVar8 - (sVar7 + 0xf & 0xfffffffffffffff0));
  local_230 = peVar8;
  peVar8[-1].x_[1] = 9.31109199233371e-318;
  iVar6 = GEO::expansion::diff_capacity(dVar2,dVar1);
  peVar9 = local_230;
  peVar8[-1].x_[1] = 9.31116116152413e-318;
  GEO::expansion::expansion(peVar9,iVar6);
  dVar2 = h1_local;
  dVar1 = dStack_70;
  peVar9 = local_230;
  peVar8[-1].x_[1] = 9.31126985596622e-318;
  Delta1 = GEO::expansion::assign_diff(peVar9,dVar2,dVar1);
  peVar5 = a22;
  peVar12 = a23;
  peVar11 = a24;
  peVar16 = a32;
  peVar10 = a33;
  peVar14 = a34;
  peVar13 = a42;
  peVar9 = a43;
  peVar8[-1].x_[0] = (double)a44;
  *(expansion **)(peVar8 + -1) = peVar9;
  peVar8[-2].x_[1] = (double)peVar13;
  peVar8[-2].x_[0] = 9.31172933701685e-318;
  iVar6 = GEO::expansion::det3x3_capacity
                    (peVar5,peVar12,peVar11,peVar16,peVar10,peVar14,(expansion *)peVar8[-2].x_[1],
                     *(expansion **)(peVar8 + -1),(expansion *)peVar8[-1].x_[0]);
  peVar8[-1].x_[1] = 9.31178368423789e-318;
  sVar7 = GEO::expansion::bytes(iVar6);
  peVar5 = a22;
  peVar12 = a23;
  peVar11 = a24;
  peVar16 = a32;
  peVar10 = a33;
  peVar14 = a34;
  peVar13 = a42;
  peVar9 = a43;
  peVar8 = (expansion *)((long)peVar8 - (sVar7 + 0xf & 0xfffffffffffffff0));
  local_228 = peVar8;
  peVar8[-1].x_[0] = (double)a44;
  *(expansion **)(peVar8 + -1) = peVar9;
  peVar8[-2].x_[1] = (double)peVar13;
  peVar8[-2].x_[0] = 9.31234197841769e-318;
  iVar6 = GEO::expansion::det3x3_capacity
                    (peVar5,peVar12,peVar11,peVar16,peVar10,peVar14,(expansion *)peVar8[-2].x_[1],
                     *(expansion **)(peVar8 + -1),(expansion *)peVar8[-1].x_[0]);
  peVar9 = local_228;
  peVar8[-1].x_[1] = 9.31243091023394e-318;
  GEO::expansion::expansion(peVar9,iVar6);
  peVar15 = a22;
  peVar5 = a23;
  peVar12 = a24;
  peVar11 = a32;
  peVar16 = a33;
  peVar10 = a34;
  peVar14 = a42;
  peVar13 = a43;
  peVar9 = local_228;
  peVar8[-1].x_[1] = (double)a44;
  peVar8[-1].x_[0] = (double)peVar13;
  *(expansion **)(peVar8 + -1) = peVar14;
  peVar8[-2].x_[1] = (double)peVar10;
  peVar8[-2].x_[0] = 9.31291015391041e-318;
  Delta2 = GEO::expansion::assign_det3x3
                     (peVar9,peVar15,peVar5,peVar12,peVar11,peVar16,(expansion *)peVar8[-2].x_[1],
                      *(expansion **)(peVar8 + -1),(expansion *)peVar8[-1].x_[0],
                      (expansion *)peVar8[-1].x_[1]);
  peVar5 = a12;
  peVar12 = a13;
  peVar11 = a14;
  peVar16 = a32;
  peVar10 = a33;
  peVar14 = a34;
  peVar13 = a42;
  peVar9 = a43;
  peVar8[-1].x_[0] = (double)a44;
  *(expansion **)(peVar8 + -1) = peVar9;
  peVar8[-2].x_[1] = (double)peVar13;
  peVar8[-2].x_[0] = 9.31335975364813e-318;
  iVar6 = GEO::expansion::det3x3_capacity
                    (peVar5,peVar12,peVar11,peVar16,peVar10,peVar14,(expansion *)peVar8[-2].x_[1],
                     *(expansion **)(peVar8 + -1),(expansion *)peVar8[-1].x_[0]);
  peVar8[-1].x_[1] = 9.31341410086917e-318;
  sVar7 = GEO::expansion::bytes(iVar6);
  peVar5 = a12;
  peVar12 = a13;
  peVar11 = a14;
  peVar16 = a32;
  peVar10 = a33;
  peVar14 = a34;
  peVar13 = a42;
  peVar9 = a43;
  peVar8 = (expansion *)((long)peVar8 - (sVar7 + 0xf & 0xfffffffffffffff0));
  local_220 = peVar8;
  peVar8[-1].x_[0] = (double)a44;
  *(expansion **)(peVar8 + -1) = peVar9;
  peVar8[-2].x_[1] = (double)peVar13;
  peVar8[-2].x_[0] = 9.31394275111022e-318;
  iVar6 = GEO::expansion::det3x3_capacity
                    (peVar5,peVar12,peVar11,peVar16,peVar10,peVar14,(expansion *)peVar8[-2].x_[1],
                     *(expansion **)(peVar8 + -1),(expansion *)peVar8[-1].x_[0]);
  peVar9 = local_220;
  peVar8[-1].x_[1] = 9.31403168292647e-318;
  GEO::expansion::expansion(peVar9,iVar6);
  peVar15 = a12;
  peVar5 = a13;
  peVar12 = a14;
  peVar11 = a32;
  peVar16 = a33;
  peVar10 = a34;
  peVar14 = a42;
  peVar13 = a43;
  peVar9 = local_220;
  peVar8[-1].x_[1] = (double)a44;
  peVar8[-1].x_[0] = (double)peVar13;
  *(expansion **)(peVar8 + -1) = peVar14;
  peVar8[-2].x_[1] = (double)peVar10;
  peVar8[-2].x_[0] = 9.31448128266419e-318;
  Delta3 = GEO::expansion::assign_det3x3
                     (peVar9,peVar15,peVar5,peVar12,peVar11,peVar16,(expansion *)peVar8[-2].x_[1],
                      *(expansion **)(peVar8 + -1),(expansion *)peVar8[-1].x_[0],
                      (expansion *)peVar8[-1].x_[1]);
  peVar5 = a12;
  peVar12 = a13;
  peVar11 = a14;
  peVar16 = a22;
  peVar10 = a23;
  peVar14 = a24;
  peVar13 = a42;
  peVar9 = a43;
  peVar8[-1].x_[0] = (double)a44;
  *(expansion **)(peVar8 + -1) = peVar9;
  peVar8[-2].x_[1] = (double)peVar13;
  peVar8[-2].x_[0] = 9.3149308824019e-318;
  iVar6 = GEO::expansion::det3x3_capacity
                    (peVar5,peVar12,peVar11,peVar16,peVar10,peVar14,(expansion *)peVar8[-2].x_[1],
                     *(expansion **)(peVar8 + -1),(expansion *)peVar8[-1].x_[0]);
  peVar8[-1].x_[1] = 9.31498522962294e-318;
  sVar7 = GEO::expansion::bytes(iVar6);
  peVar5 = a12;
  peVar12 = a13;
  peVar11 = a14;
  peVar16 = a22;
  peVar10 = a23;
  peVar14 = a24;
  peVar13 = a42;
  peVar9 = a43;
  peVar8 = (expansion *)((long)peVar8 - (sVar7 + 0xf & 0xfffffffffffffff0));
  local_218 = peVar8;
  peVar8[-1].x_[0] = (double)a44;
  *(expansion **)(peVar8 + -1) = peVar9;
  peVar8[-2].x_[1] = (double)peVar13;
  peVar8[-2].x_[0] = 9.31551387986399e-318;
  iVar6 = GEO::expansion::det3x3_capacity
                    (peVar5,peVar12,peVar11,peVar16,peVar10,peVar14,(expansion *)peVar8[-2].x_[1],
                     *(expansion **)(peVar8 + -1),(expansion *)peVar8[-1].x_[0]);
  peVar9 = local_218;
  peVar8[-1].x_[1] = 9.31560281168025e-318;
  GEO::expansion::expansion(peVar9,iVar6);
  peVar15 = a12;
  peVar5 = a13;
  peVar12 = a14;
  peVar11 = a22;
  peVar16 = a23;
  peVar10 = a24;
  peVar14 = a42;
  peVar13 = a43;
  peVar9 = local_218;
  peVar8[-1].x_[1] = (double)a44;
  peVar8[-1].x_[0] = (double)peVar13;
  *(expansion **)(peVar8 + -1) = peVar14;
  peVar8[-2].x_[1] = (double)peVar10;
  peVar8[-2].x_[0] = 9.31605241141796e-318;
  Delta4 = GEO::expansion::assign_det3x3
                     (peVar9,peVar15,peVar5,peVar12,peVar11,peVar16,(expansion *)peVar8[-2].x_[1],
                      *(expansion **)(peVar8 + -1),(expansion *)peVar8[-1].x_[0],
                      (expansion *)peVar8[-1].x_[1]);
  peVar5 = a12;
  peVar12 = a13;
  peVar11 = a14;
  peVar16 = a22;
  peVar10 = a23;
  peVar14 = a24;
  peVar13 = a32;
  peVar9 = a33;
  peVar8[-1].x_[0] = (double)a34;
  *(expansion **)(peVar8 + -1) = peVar9;
  peVar8[-2].x_[1] = (double)peVar13;
  peVar8[-2].x_[0] = 9.31650201115568e-318;
  iVar6 = GEO::expansion::det3x3_capacity
                    (peVar5,peVar12,peVar11,peVar16,peVar10,peVar14,(expansion *)peVar8[-2].x_[1],
                     *(expansion **)(peVar8 + -1),(expansion *)peVar8[-1].x_[0]);
  peVar8[-1].x_[1] = 9.31655635837672e-318;
  sVar7 = GEO::expansion::bytes(iVar6);
  peVar5 = a12;
  peVar12 = a13;
  peVar11 = a14;
  peVar16 = a22;
  peVar10 = a23;
  peVar14 = a24;
  peVar13 = a33;
  peVar9 = a34;
  peVar8 = (expansion *)((long)peVar8 - (sVar7 + 0xf & 0xfffffffffffffff0));
  local_210 = peVar8;
  peVar8[-2].x_[1] = (double)a32;
  *(expansion **)(peVar8 + -1) = peVar13;
  peVar8[-1].x_[0] = (double)peVar9;
  peVar8[-2].x_[0] = 9.31708500861777e-318;
  iVar6 = GEO::expansion::det3x3_capacity
                    (peVar5,peVar12,peVar11,peVar16,peVar10,peVar14,(expansion *)peVar8[-2].x_[1],
                     *(expansion **)(peVar8 + -1),(expansion *)peVar8[-1].x_[0]);
  peVar9 = local_210;
  peVar8[-1].x_[1] = 9.31717394043402e-318;
  GEO::expansion::expansion(peVar9,iVar6);
  peVar15 = a12;
  peVar5 = a13;
  peVar12 = a14;
  peVar11 = a22;
  peVar16 = a23;
  peVar10 = a32;
  peVar14 = a33;
  peVar13 = a34;
  peVar9 = local_210;
  peVar8[-2].x_[1] = (double)a24;
  *(expansion **)(peVar8 + -1) = peVar10;
  peVar8[-1].x_[0] = (double)peVar14;
  peVar8[-1].x_[1] = (double)peVar13;
  peVar8[-2].x_[0] = 9.31762848082819e-318;
  peVar9 = GEO::expansion::assign_det3x3
                     (peVar9,peVar15,peVar5,peVar12,peVar11,peVar16,(expansion *)peVar8[-2].x_[1],
                      *(expansion **)(peVar8 + -1),(expansion *)peVar8[-1].x_[0],
                      (expansion *)peVar8[-1].x_[1]);
  peStack_118 = peVar9;
  peVar8[-1].x_[1] = 9.31774211592674e-318;
  local_11c = GEO::expansion::sign
                        (peVar9,(EVP_PKEY_CTX *)peVar15,sig,(size_t *)peVar12,(uchar *)peVar11,
                         (size_t)peVar16);
  peVar13 = a21;
  peVar9 = Delta2;
  if (local_11c == 0) {
    local_2b0 = &local_141;
    peVar8[-1].x_[1] = 9.31792986087216e-318;
    std::allocator<char>::allocator();
    paVar4 = local_2b0;
    peVar8[-1].x_[1] = 9.31805831794008e-318;
    std::__cxx11::string::string(local_140,"Delta4_sign != ZERO",paVar4);
    local_2b8 = (allocator *)((long)&r_1 + 7);
    peVar8[-1].x_[1] = 9.3181620717257e-318;
    std::allocator<char>::allocator();
    paVar4 = local_2b8;
    peVar8[-1].x_[1] = 9.31829052879362e-318;
    std::__cxx11::string::string
              (local_178,
               "/workspace/llm4binary/github/license_all_cmakelists_25/simogasp[P]delaunay-psm/delaunay-psm/Delaunay_psm.cpp"
               ,paVar4);
    peVar8[-1].x_[1] = (double)&LAB_001cc775;
    GEO::geo_assertion_failed((string *)local_140,(string *)local_178,0x5007);
  }
  peVar8[-1].x_[1] = 9.31907115251405e-318;
  iVar6 = GEO::expansion::product_capacity(peVar9,peVar13);
  peVar8[-1].x_[1] = 9.31910573710926e-318;
  sVar7 = GEO::expansion::bytes(iVar6);
  peVar13 = a21;
  peVar9 = Delta2;
  peVar8 = (expansion *)((long)peVar8 - (sVar7 + 0xf & 0xfffffffffffffff0));
  local_2e0 = peVar8;
  peVar8[-1].x_[1] = 9.31933300730635e-318;
  iVar6 = GEO::expansion::product_capacity(peVar9,peVar13);
  peVar9 = local_2e0;
  peVar8[-1].x_[1] = 9.31940217649676e-318;
  GEO::expansion::expansion(peVar9,iVar6);
  peVar14 = a21;
  peVar13 = Delta2;
  peVar9 = local_2e0;
  peVar8[-1].x_[1] = 9.31953063356468e-318;
  peVar10 = GEO::expansion::assign_product(peVar9,peVar13,peVar14);
  peVar13 = a31;
  peVar9 = Delta3;
  peVar8[-1].x_[1] = 9.3196590906326e-318;
  iVar6 = GEO::expansion::product_capacity(peVar9,peVar13);
  peVar8[-1].x_[1] = 9.31969367522781e-318;
  sVar7 = GEO::expansion::bytes(iVar6);
  peVar13 = a31;
  peVar9 = Delta3;
  peVar8 = (expansion *)((long)peVar8 - (sVar7 + 0xf & 0xfffffffffffffff0));
  local_2d8 = peVar8;
  peVar8[-1].x_[1] = 9.3199209454249e-318;
  iVar6 = GEO::expansion::product_capacity(peVar9,peVar13);
  peVar9 = local_2d8;
  peVar8[-1].x_[1] = 9.31999011461532e-318;
  GEO::expansion::expansion(peVar9,iVar6);
  peVar14 = a31;
  peVar13 = Delta3;
  peVar9 = local_2d8;
  peVar8[-1].x_[1] = 9.32011857168323e-318;
  peVar9 = GEO::expansion::assign_product(peVar9,peVar13,peVar14);
  peVar8[-1].x_[1] = 9.3201580969349e-318;
  peVar11 = GEO::expansion::negate(peVar9);
  peVar13 = a41;
  peVar9 = Delta4;
  peVar8[-1].x_[1] = 9.32028655400282e-318;
  iVar6 = GEO::expansion::product_capacity(peVar9,peVar13);
  peVar8[-1].x_[1] = 9.32032113859803e-318;
  sVar7 = GEO::expansion::bytes(iVar6);
  peVar13 = a41;
  peVar9 = Delta4;
  peVar8 = (expansion *)((long)peVar8 - (sVar7 + 0xf & 0xfffffffffffffff0));
  local_2d0 = peVar8;
  peVar8[-1].x_[1] = 9.32054840879512e-318;
  iVar6 = GEO::expansion::product_capacity(peVar9,peVar13);
  peVar9 = local_2d0;
  peVar8[-1].x_[1] = 9.32061757798553e-318;
  GEO::expansion::expansion(peVar9,iVar6);
  peVar14 = a41;
  peVar13 = Delta4;
  peVar9 = local_2d0;
  peVar8[-1].x_[1] = 9.32074603505345e-318;
  peVar12 = GEO::expansion::assign_product(peVar9,peVar13,peVar14);
  peVar13 = Delta1;
  peVar9 = peStack_118;
  peVar8[-1].x_[1] = 9.32087449212137e-318;
  iVar6 = GEO::expansion::product_capacity(peVar9,peVar13);
  peVar8[-1].x_[1] = 9.32090907671658e-318;
  sVar7 = GEO::expansion::bytes(iVar6);
  peVar13 = Delta1;
  peVar9 = peStack_118;
  peVar8 = (expansion *)((long)peVar8 - (sVar7 + 0xf & 0xfffffffffffffff0));
  local_2c8 = peVar8;
  peVar8[-1].x_[1] = 9.32113634691367e-318;
  iVar6 = GEO::expansion::product_capacity(peVar9,peVar13);
  peVar9 = local_2c8;
  peVar8[-1].x_[1] = 9.32120551610408e-318;
  GEO::expansion::expansion(peVar9,iVar6);
  peVar14 = Delta1;
  peVar13 = peStack_118;
  peVar9 = local_2c8;
  peVar8[-1].x_[1] = 9.321333973172e-318;
  peVar9 = GEO::expansion::assign_product(peVar9,peVar13,peVar14);
  peVar8[-1].x_[1] = 9.32137349842367e-318;
  peVar13 = GEO::expansion::negate(peVar9);
  peVar8[-1].x_[1] = 9.32157112468201e-318;
  iVar6 = GEO::expansion::sum_capacity(peVar10,peVar11,peVar12,peVar13);
  peVar8[-1].x_[1] = 9.32160570927722e-318;
  sVar7 = GEO::expansion::bytes(iVar6);
  peVar8 = (expansion *)((long)peVar8 - (sVar7 + 0xf & 0xfffffffffffffff0));
  local_2c0 = peVar8;
  peVar8[-1].x_[1] = 9.32190214866472e-318;
  iVar6 = GEO::expansion::sum_capacity(peVar10,peVar11,peVar12,peVar13);
  peVar9 = local_2c0;
  peVar8[-1].x_[1] = 9.32197131785514e-318;
  GEO::expansion::expansion(peVar9,iVar6);
  peVar9 = local_2c0;
  peVar8[-1].x_[1] = 9.32216894411348e-318;
  peVar9 = GEO::expansion::assign_sum(peVar9,peVar10,peVar11,peVar12,peVar13);
  peVar8[-1].x_[1] = 9.32226281658619e-318;
  p_sort[4]._4_4_ =
       GEO::expansion::sign
                 (peVar9,(EVP_PKEY_CTX *)peVar10,sig_00,(size_t *)peVar12,(uchar *)peVar13,
                  (size_t)peVar16);
  if (((a11._7_1_ & 1) != 0) && (p_sort[4]._4_4_ == 0)) {
    pdStack_1d8 = p1_local;
    p_sort[0] = p2_local;
    p_sort[1] = p3_local;
    p_sort[2] = p4_local;
    p_sort[3] = (double *)h0_local;
    peVar9 = (expansion *)(p_sort + 4);
    peVar8[-1].x_[1] = 9.32281617010953e-318;
    SOS_sort(&stack0xfffffffffffffe28,(double **)peVar9,3);
    sig_02 = extraout_RDX;
    for (z1._4_4_ = 0; peVar11 = Delta2, peVar10 = Delta3, peVar14 = Delta4, z1._4_4_ < 5;
        z1._4_4_ = z1._4_4_ + 1) {
      if (p_sort[(ulong)z1._4_4_ - 1] == p1_local) {
        peVar8[-1].x_[1] = 9.32314225343578e-318;
        iVar6 = GEO::expansion::diff_capacity(peVar10,peVar11);
        peVar8[-1].x_[1] = 9.32317683803099e-318;
        sVar7 = GEO::expansion::bytes(iVar6);
        peVar14 = Delta2;
        peVar9 = Delta3;
        peVar8 = (expansion *)((long)peVar8 - (sVar7 + 0xf & 0xfffffffffffffff0));
        local_2f8 = peVar8;
        peVar8[-1].x_[1] = 9.32340410822808e-318;
        iVar6 = GEO::expansion::diff_capacity(peVar9,peVar14);
        peVar9 = local_2f8;
        peVar8[-1].x_[1] = 9.3234732774185e-318;
        GEO::expansion::expansion(peVar9,iVar6);
        peVar10 = Delta2;
        peVar14 = Delta3;
        peVar9 = local_2f8;
        peVar8[-1].x_[1] = 9.32360173448641e-318;
        z2 = GEO::expansion::assign_diff(peVar9,peVar14,peVar10);
        peVar14 = Delta4;
        peVar9 = peStack_118;
        peVar8[-1].x_[1] = 9.32373019155433e-318;
        iVar6 = GEO::expansion::diff_capacity(peVar9,peVar14);
        peVar8[-1].x_[1] = 9.32376477614954e-318;
        sVar7 = GEO::expansion::bytes(iVar6);
        peVar14 = Delta4;
        peVar9 = peStack_118;
        peVar8 = (expansion *)((long)peVar8 - (sVar7 + 0xf & 0xfffffffffffffff0));
        local_2f0 = peVar8;
        peVar8[-1].x_[1] = 9.32399204634663e-318;
        iVar6 = GEO::expansion::diff_capacity(peVar9,peVar14);
        peVar9 = local_2f0;
        peVar8[-1].x_[1] = 9.32406121553705e-318;
        GEO::expansion::expansion(peVar9,iVar6);
        peVar10 = Delta4;
        peVar14 = peStack_118;
        peVar9 = local_2f0;
        peVar8[-1].x_[1] = 9.32418967260497e-318;
        peVar14 = GEO::expansion::assign_diff(peVar9,peVar14,peVar10);
        peVar9 = z2;
        z = peVar14;
        peVar8[-1].x_[1] = 9.32431812967288e-318;
        iVar6 = GEO::expansion::sum_capacity(peVar9,peVar14);
        peVar8[-1].x_[1] = 9.32435271426809e-318;
        sVar7 = GEO::expansion::bytes(iVar6);
        peVar14 = z2;
        peVar9 = z;
        peVar12 = (expansion *)(sVar7 + 0xf & 0xfffffffffffffff0);
        peVar8 = (expansion *)((long)peVar8 - (long)peVar12);
        local_2e8 = peVar8;
        peVar8[-1].x_[1] = 9.32457998446518e-318;
        iVar6 = GEO::expansion::sum_capacity(peVar14,peVar9);
        peVar9 = local_2e8;
        peVar8[-1].x_[1] = 9.3246491536556e-318;
        GEO::expansion::expansion(peVar9,iVar6);
        peVar9 = z2;
        peVar10 = z;
        peVar14 = local_2e8;
        peVar8[-1].x_[1] = 9.32477761072352e-318;
        peVar14 = GEO::expansion::assign_sum(peVar14,peVar9,peVar10);
        _Delta1_sign = peVar14;
        peVar8[-1].x_[1] = 9.32487148319623e-318;
        Delta2_sign = GEO::expansion::sign
                                (peVar14,(EVP_PKEY_CTX *)peVar9,sig_01,(size_t *)peVar12,
                                 (uchar *)peVar13,(size_t)peVar16);
        sig_02 = extraout_RDX_00;
        if (Delta2_sign != ZERO) {
          return local_11c * Delta2_sign;
        }
      }
      else if (p_sort[(ulong)z1._4_4_ - 1] == p2_local) {
        peVar8[-1].x_[1] = 9.32523215111769e-318;
        Delta3_sign = GEO::expansion::sign
                                (peVar11,(EVP_PKEY_CTX *)peVar9,sig_02,(size_t *)peVar12,
                                 (uchar *)peVar13,(size_t)peVar16);
        sig_02 = extraout_RDX_01;
        if (Delta3_sign != ZERO) {
          return local_11c * Delta3_sign;
        }
      }
      else if (p_sort[(ulong)z1._4_4_ - 1] == p3_local) {
        peVar8[-1].x_[1] = 9.32559281903916e-318;
        local_204 = GEO::expansion::sign
                              (peVar10,(EVP_PKEY_CTX *)peVar9,sig_02,(size_t *)peVar12,
                               (uchar *)peVar13,(size_t)peVar16);
        sig_02 = extraout_RDX_02;
        if (local_204 != 0) {
          return -local_11c * local_204;
        }
      }
      else if (p_sort[(ulong)z1._4_4_ - 1] == p4_local) {
        peVar8[-1].x_[1] = 9.32594854630416e-318;
        local_208 = GEO::expansion::sign
                              (peVar14,(EVP_PKEY_CTX *)peVar9,sig_02,(size_t *)peVar12,
                               (uchar *)peVar13,(size_t)peVar16);
        sig_02 = extraout_RDX_03;
        if (local_208 != 0) {
          return local_11c * local_208;
        }
      }
      else if (p_sort[(ulong)z1._4_4_ - 1] == (double *)h0_local) {
        return NEGATIVE;
      }
    }
  }
  return local_11c * p_sort[4]._4_4_;
}

Assistant:

Sign side4h_3d_exact_SOS(
        const double* p0, const double* p1,
        const double* p2, const double* p3, const double* p4,
        double h0, double h1, double h2, double h3, double h4,
        bool sos = true
    ) {
        PCK_STAT(cnt_orient3dh_exact++);

        const expansion& a11 = expansion_diff(p1[0], p0[0]);
        const expansion& a12 = expansion_diff(p1[1], p0[1]);
        const expansion& a13 = expansion_diff(p1[2], p0[2]);
        const expansion& a14 = expansion_diff(h0,h1);

        const expansion& a21 = expansion_diff(p2[0], p0[0]);
        const expansion& a22 = expansion_diff(p2[1], p0[1]);
        const expansion& a23 = expansion_diff(p2[2], p0[2]);
        const expansion& a24 = expansion_diff(h0,h2);

        const expansion& a31 = expansion_diff(p3[0], p0[0]);
        const expansion& a32 = expansion_diff(p3[1], p0[1]);
        const expansion& a33 = expansion_diff(p3[2], p0[2]);
        const expansion& a34 = expansion_diff(h0,h3);

        const expansion& a41 = expansion_diff(p4[0], p0[0]);
        const expansion& a42 = expansion_diff(p4[1], p0[1]);
        const expansion& a43 = expansion_diff(p4[2], p0[2]);
        const expansion& a44 = expansion_diff(h0,h4);

        // Note: we could probably reuse some of the 2x2 co-factors
        // (but for now I'd rather keep this form that is easier to
        //  read ... and to debug if need be !)
        const expansion& Delta1 = expansion_det3x3(
            a21, a22, a23,
            a31, a32, a33,
            a41, a42, a43
        );
        const expansion& Delta2 = expansion_det3x3(
            a11, a12, a13,
            a31, a32, a33,
            a41, a42, a43
        );
        const expansion& Delta3 = expansion_det3x3(
            a11, a12, a13,
            a21, a22, a23,
            a41, a42, a43
        );
        const expansion& Delta4 = expansion_det3x3(
            a11, a12, a13,
            a21, a22, a23,
            a31, a32, a33
        );

        Sign Delta4_sign = Delta4.sign();
        geo_assert(Delta4_sign != ZERO);

        const expansion& r_1 = expansion_product(Delta1, a14);
        const expansion& r_2 = expansion_product(Delta2, a24).negate();
        const expansion& r_3 = expansion_product(Delta3, a34);
        const expansion& r_4 = expansion_product(Delta4, a44).negate();
        const expansion& r = expansion_sum4(r_1, r_2, r_3, r_4);

        Sign r_sign = r.sign();

        // Statistics
        PCK_STAT(len_orient3dh_num = std::max(len_orient3dh_num, r.length()));
        PCK_STAT(len_orient3dh_denom = std::max(len_orient3dh_denom, Delta1.length()));

        // Simulation of Simplicity (symbolic perturbation)
        if(sos && r_sign == ZERO) {
            PCK_STAT(cnt_orient3dh_SOS++);
            const double* p_sort[5];
            p_sort[0] = p0;
            p_sort[1] = p1;
            p_sort[2] = p2;
            p_sort[3] = p3;
            p_sort[4] = p4;

	    SOS_sort(p_sort, p_sort + 5, 3);
            for(index_t i = 0; i < 5; ++i) {
                if(p_sort[i] == p0) {
                    const expansion& z1 = expansion_diff(Delta2, Delta1);
                    const expansion& z2 = expansion_diff(Delta4, Delta3);
                    const expansion& z = expansion_sum(z1, z2);
                    Sign z_sign = z.sign();
                    PCK_STAT(len_orient3dh_SOS = std::max(len_orient3dh_SOS, z.length()));
                    if(z_sign != ZERO) {
                        return Sign(Delta4_sign * z_sign);
                    }
                } else if(p_sort[i] == p1) {
                    Sign Delta1_sign = Delta1.sign();
                    if(Delta1_sign != ZERO) {
                        PCK_STAT(len_orient3dh_SOS = std::max(len_orient3dh_SOS, Delta1.length()));
                        return Sign(Delta4_sign * Delta1_sign);
                    }
                } else if(p_sort[i] == p2) {
                    Sign Delta2_sign = Delta2.sign();
                    if(Delta2_sign != ZERO) {
                        PCK_STAT(len_orient3dh_SOS = std::max(len_orient3dh_SOS, Delta2.length()));
                        return Sign(-Delta4_sign * Delta2_sign);
                    }
                } else if(p_sort[i] == p3) {
                    Sign Delta3_sign = Delta3.sign();
                    if(Delta3_sign != ZERO) {
                        PCK_STAT(len_orient3dh_SOS = std::max(len_orient3dh_SOS, Delta3.length()));
                        return Sign(Delta4_sign * Delta3_sign);
                    }
                } else if(p_sort[i] == p4) {
                    return NEGATIVE;
                }
            }
        }
        return Sign(Delta4_sign * r_sign);
    }